

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::Tensor::ByteSizeLong(Tensor *this)

{
  int iVar1;
  uint32 uVar2;
  size_t sVar3;
  size_t sVar4;
  int cached_size;
  int cached_size_1;
  size_t data_size;
  size_t total_size;
  Tensor *this_local;
  
  data_size = 0;
  sVar3 = google::protobuf::internal::WireFormatLite::Int64Size(&this->dimvalue_);
  if (sVar3 != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar3);
    data_size = sVar4 + 1;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sVar3);
  this->_dimvalue_cached_byte_size_ = iVar1;
  data_size = sVar3 + data_size;
  uVar2 = rank(this);
  if (uVar2 != 0) {
    uVar2 = rank(this);
    sVar3 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar2);
    data_size = sVar3 + 1 + data_size;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(data_size);
  this->_cached_size_ = iVar1;
  return data_size;
}

Assistant:

size_t Tensor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Tensor)
  size_t total_size = 0;

  // repeated int64 dimValue = 2;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->dimvalue_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _dimvalue_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // uint32 rank = 1;
  if (this->rank() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt32Size(
        this->rank());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}